

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O2

Extra_UnateInfo_t * Extra_UnateInfoCreateFromZdd(DdManager *dd,DdNode *zPairs,DdNode *bSupp)

{
  int iVar1;
  Extra_UnateInfo_t *pEVar2;
  void *__ptr;
  long lVar3;
  DdNode *n;
  DdNode *n_00;
  uint uVar4;
  
  iVar1 = Extra_bddSuppSize(dd,bSupp);
  pEVar2 = Extra_UnateInfoAllocate(iVar1);
  iVar1 = dd->size;
  __ptr = calloc(1,(long)iVar1 << 2);
  pEVar2->nVarsMax = iVar1;
  lVar3 = 0;
  for (; bSupp != dd->one; bSupp = (bSupp->type).kids.T) {
    pEVar2->pVars[lVar3] =
         (Extra_UnateVar_t)((uint)pEVar2->pVars[lVar3] & 0xc0000000 | bSupp->index & 0x3fffffff);
    *(int *)((long)__ptr + (ulong)bSupp->index * 4) = (int)lVar3;
    lVar3 = lVar3 + 1;
  }
  Cudd_Ref(zPairs);
  while( true ) {
    if (zPairs == dd->zero) {
      Cudd_RecursiveDerefZdd(dd,zPairs);
      free(__ptr);
      return pEVar2;
    }
    n = Extra_zddSelectOneSubset(dd,zPairs);
    Cudd_Ref(n);
    if (((n->type).kids.T != dd->one) || ((n->type).kids.E != dd->zero)) break;
    uVar4 = 0x80000000;
    if ((n->index & 1) == 0) {
      uVar4 = 0x40000000;
    }
    pEVar2->pVars[*(int *)((long)__ptr + (ulong)(n->index >> 1) * 4)] =
         (Extra_UnateVar_t)
         ((uint)pEVar2->pVars[*(int *)((long)__ptr + (ulong)(n->index >> 1) * 4)] | uVar4);
    pEVar2->nUnate = pEVar2->nUnate + 1;
    n_00 = Cudd_zddDiff(dd,zPairs,n);
    Cudd_Ref(n_00);
    Cudd_RecursiveDerefZdd(dd,zPairs);
    Cudd_RecursiveDerefZdd(dd,n);
    zPairs = n_00;
  }
  __assert_fail("cuddT(zCube) == z1 && cuddE(zCube) == z0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddUnate.c"
                ,0x104,
                "Extra_UnateInfo_t *Extra_UnateInfoCreateFromZdd(DdManager *, DdNode *, DdNode *)");
}

Assistant:

Extra_UnateInfo_t * Extra_UnateInfoCreateFromZdd( DdManager * dd, DdNode * zPairs, DdNode * bSupp )
{
    Extra_UnateInfo_t * p;
    DdNode * bTemp, * zSet, * zCube, * zTemp;
    int * pMapVars2Nums;
    int i, nSuppSize;

    nSuppSize = Extra_bddSuppSize( dd, bSupp );

    // allocate and clean the storage for symmetry info
    p = Extra_UnateInfoAllocate( nSuppSize );

    // allocate the storage for the temporary map
    pMapVars2Nums = ABC_ALLOC( int, dd->size );
    memset( pMapVars2Nums, 0, dd->size * sizeof(int) );

    // assign the variables
    p->nVarsMax = dd->size;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
    {
        p->pVars[i].iVar = bTemp->index;
        pMapVars2Nums[bTemp->index] = i;
    }

    // write the symmetry info into the structure
    zSet = zPairs;   Cudd_Ref( zSet );
//    Cudd_zddPrintCover( dd, zPairs );    printf( "\n" );
    while ( zSet != z0 )
    {
        // get the next cube
        zCube  = Extra_zddSelectOneSubset( dd, zSet );    Cudd_Ref( zCube );

        // add this var to the data structure
        assert( cuddT(zCube) == z1 && cuddE(zCube) == z0 );
        if ( zCube->index & 1 ) // neg
            p->pVars[ pMapVars2Nums[zCube->index/2] ].Neg = 1;
        else
            p->pVars[ pMapVars2Nums[zCube->index/2] ].Pos = 1;
        // count the unate vars
        p->nUnate++;

        // update the cuver and deref the cube
        zSet = Cudd_zddDiff( dd, zTemp = zSet, zCube );     Cudd_Ref( zSet );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zCube );

    } // for each cube 
    Cudd_RecursiveDerefZdd( dd, zSet );
    ABC_FREE( pMapVars2Nums );
    return p;

}